

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::EndColumns(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiOldColumns *pIVar3;
  ImGuiOldColumns *pIVar4;
  ImGuiOldColumnData *pIVar5;
  ImGuiCol idx;
  ImVec2 IVar6;
  bool bVar7;
  ImU32 col;
  long lVar8;
  int iVar9;
  int column_index;
  long lVar10;
  ulong uVar11;
  ImGuiID id;
  uint uVar12;
  float fVar13;
  float fVar14;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  bool local_9a;
  bool local_99;
  uint local_98;
  float local_94;
  ulong local_90;
  float local_84;
  ImVec2 local_80;
  ImVec2 local_78;
  ImRect local_70;
  ImGuiContext *local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  local_60 = GImGui;
  GImGui->CurrentWindow->WriteAccessed = true;
  pIVar2 = local_60->CurrentWindow;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar3->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge(&pIVar3->Splitter,pIVar2->DrawList);
  }
  local_98 = pIVar3->Flags;
  fVar13 = (pIVar2->DC).CursorPos.y;
  uVar12 = -(uint)(fVar13 <= pIVar3->LineMaxY);
  fVar13 = (float)(~uVar12 & (uint)fVar13 | (uint)pIVar3->LineMaxY & uVar12);
  pIVar3->LineMaxY = fVar13;
  (pIVar2->DC).CursorPos.y = fVar13;
  if ((local_98 & 0x10) == 0) {
    (pIVar2->DC).CursorMaxPos.x = pIVar3->HostCursorMaxPosX;
  }
  if (((local_98 & 1) == 0) && (pIVar2->SkipItems == false)) {
    local_90 = 0xffffffff;
    if (1 < pIVar3->Count) {
      local_94 = (pIVar2->DC).CursorPos.y;
      fVar13 = (pIVar2->ClipRect).Min.y;
      uVar12 = -(uint)(fVar13 <= pIVar3->HostCursorPosY);
      local_58 = (float)(~uVar12 & (uint)fVar13 | (uint)pIVar3->HostCursorPosY & uVar12);
      fVar13 = (pIVar2->ClipRect).Max.y;
      if (fVar13 <= local_94) {
        local_94 = fVar13;
      }
      uStack_54 = 0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_84 = local_58 + 1.0;
      local_90 = 0xffffffff;
      uVar11 = 1;
      lVar10 = 0;
      do {
        pIVar4 = (GImGui->CurrentWindow->DC).CurrentColumns;
        if (pIVar4 == (ImGuiOldColumns *)0x0) {
          local_70.Max.x = 0.0;
        }
        else {
          local_70.Max.x =
               (pIVar4->OffMaxX - pIVar4->OffMinX) *
               *(float *)((long)&(pIVar4->Columns).Data[1].OffsetNorm + lVar10) + pIVar4->OffMinX;
        }
        pIVar5 = (pIVar3->Columns).Data;
        local_70.Max.x = local_70.Max.x + (pIVar2->Pos).x;
        id = pIVar3->ID + (int)uVar11;
        local_70.Min.x = local_70.Max.x + -4.0;
        local_48 = ZEXT416((uint)local_70.Max.x);
        local_70.Max.x = local_70.Max.x + 4.0;
        local_70.Min.y = local_58;
        local_70.Max.y = local_94;
        bVar7 = ItemAdd(&local_70,id,(ImRect *)0x0,8);
        if (bVar7) {
          local_99 = false;
          local_9a = false;
          if ((local_98 & 2) == 0) {
            ButtonBehavior(&local_70,id,&local_99,&local_9a,0);
            if ((local_99 != false) || (local_9a == true)) {
              local_60->MouseCursor = 4;
            }
            if (local_9a == true) {
              if ((*(byte *)((long)&pIVar5[1].Flags + lVar10) & 2) == 0) {
                local_90 = uVar11;
              }
              local_90 = local_90 & 0xffffffff;
            }
          }
          idx = (local_99 & 1) + 0x1b;
          if (local_9a != false) {
            idx = 0x1d;
          }
          col = GetColorU32(idx,1.0);
          local_80.x = (float)(int)(float)local_48._0_4_;
          local_78.y = local_84;
          local_80.y = local_94;
          local_78.x = local_80.x;
          ImDrawList::AddLine(pIVar2->DrawList,&local_78,&local_80,col,1.0);
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x1c;
      } while ((long)uVar11 < (long)pIVar3->Count);
    }
    column_index = (int)local_90;
    if (column_index != -1) {
      if ((pIVar3->IsBeingResized == false) && (-1 < pIVar3->Count)) {
        lVar10 = -1;
        lVar8 = 4;
        do {
          pIVar5 = (pIVar3->Columns).Data;
          *(undefined4 *)((long)&pIVar5->OffsetNorm + lVar8) =
               *(undefined4 *)((long)pIVar5 + lVar8 + -4);
          lVar10 = lVar10 + 1;
          lVar8 = lVar8 + 0x1c;
        } while (lVar10 < pIVar3->Count);
      }
      pIVar3->IsBeingResized = true;
      fVar13 = (((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0) -
               (GImGui->CurrentWindow->Pos).x;
      pIVar4 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar4 == (ImGuiOldColumns *)0x0) {
        fVar14 = 0.0;
      }
      else {
        if (column_index < 1) {
          iVar9 = pIVar4->Current;
        }
        else {
          iVar9 = column_index + -1;
        }
        fVar14 = (pIVar4->OffMaxX - pIVar4->OffMinX) * (pIVar4->Columns).Data[iVar9].OffsetNorm +
                 pIVar4->OffMinX;
      }
      fVar1 = (GImGui->Style).ColumnsMinSpacing;
      fVar14 = fVar14 + fVar1;
      uVar12 = -(uint)(fVar14 <= fVar13);
      fVar13 = (float)(uVar12 & (uint)fVar13 | ~uVar12 & (uint)fVar14);
      if ((pIVar3->Flags & 4) != 0) {
        if (pIVar4 == (ImGuiOldColumns *)0x0) {
          fVar14 = 0.0;
        }
        else {
          if (column_index < -1) {
            iVar9 = pIVar4->Current;
          }
          else {
            iVar9 = column_index + 1;
          }
          fVar14 = (pIVar4->OffMaxX - pIVar4->OffMinX) * (pIVar4->Columns).Data[iVar9].OffsetNorm +
                   pIVar4->OffMinX;
        }
        fVar14 = fVar14 - fVar1;
        if (fVar14 <= fVar13) {
          fVar13 = fVar14;
        }
      }
      SetColumnOffset(column_index,fVar13);
    }
    bVar7 = column_index != -1;
  }
  else {
    bVar7 = false;
  }
  pIVar3->IsBeingResized = bVar7;
  IVar6 = (pIVar2->ParentWorkRect).Max;
  (pIVar2->WorkRect).Min = (pIVar2->ParentWorkRect).Min;
  (pIVar2->WorkRect).Max = IVar6;
  IVar6 = (pIVar3->HostBackupParentWorkRect).Max;
  (pIVar2->ParentWorkRect).Min = (pIVar3->HostBackupParentWorkRect).Min;
  (pIVar2->ParentWorkRect).Max = IVar6;
  (pIVar2->DC).CurrentColumns = (ImGuiOldColumns *)0x0;
  (pIVar2->DC).ColumnsOffset.x = 0.0;
  (pIVar2->DC).CursorPos.x = (float)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        columns->Splitter.Merge(window->DrawList);
    }

    const ImGuiOldColumnFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiOldColumnFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiOldColumnFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiOldColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            if (!ItemAdd(column_hit_rect, column_id, NULL, ImGuiItemFlags_NoNav))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiOldColumnFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiOldColumnFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = window->ParentWorkRect;
    window->ParentWorkRect = columns->HostBackupParentWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}